

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

_List_iterator<long>
UnitTests::OutputElement<std::_List_iterator<long>>
          (ostream *os,_List_iterator<long> iter,_List_iterator<long> end)

{
  ostream *os_00;
  bool bVar1;
  reference t;
  _Self *p_Var2;
  expected_got_outputter<long> local_30;
  ostream *local_28;
  ostream *os_local;
  _List_iterator<long> end_local;
  _List_iterator<long> iter_local;
  
  local_28 = os;
  os_local = (ostream *)end._M_node;
  end_local = iter;
  bVar1 = std::operator!=(&end_local,(_Self *)&os_local);
  os_00 = local_28;
  if (bVar1) {
    t = std::_List_iterator<long>::operator*(&end_local);
    local_30 = stream<long>(t);
    details::operator<<(os_00,&local_30);
    p_Var2 = std::_List_iterator<long>::operator++(&end_local);
    iter_local._M_node = p_Var2->_M_node;
  }
  else {
    std::operator<<(local_28,"##EOF!##");
    iter_local = end_local;
  }
  return (_List_iterator<long>)iter_local._M_node;
}

Assistant:

It OutputElement(std::ostream& os, It iter, It end)
    {
        if (iter != end)
        {
            os << stream(*iter);
            return ++iter;
        }
        os << "##EOF!##";
        return iter;
    }